

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void ptrmapPutOvflPtr(MemPage *pPage,MemPage *pSrc,u8 *pCell,int *pRC)

{
  uint uVar1;
  long in_FS_OFFSET;
  undefined1 local_48 [20];
  ushort uStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  stack0xffffffffffffffc8 = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_4_ = 0xaaaaaaaa;
  local_48._4_4_ = 0xaaaaaaaa;
  local_48._8_4_ = 0xaaaaaaaa;
  local_48._12_4_ = 0xaaaaaaaa;
  if (*pRC == 0) {
    (*pPage->xParseCell)(pPage,pCell,(CellInfo *)local_48);
    if ((uint)uStack_34 < (uint)local_48._16_4_) {
      if ((pCell < pSrc->aDataEnd) && (pSrc->aDataEnd < pCell + uStack_34)) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11aaf,
                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
        *pRC = 0xb;
      }
      else {
        uVar1 = *(uint *)(pCell + (((ulong)stack0xffffffffffffffc8 >> 0x30) - 4));
        ptrmapPut(pPage->pBt,
                  uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18,
                  '\x03',pPage->pgno,pRC);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ptrmapPutOvflPtr(MemPage *pPage, MemPage *pSrc, u8 *pCell,int *pRC){
  CellInfo info;
  if( *pRC ) return;
  assert( pCell!=0 );
  pPage->xParseCell(pPage, pCell, &info);
  if( info.nLocal<info.nPayload ){
    Pgno ovfl;
    if( SQLITE_OVERFLOW(pSrc->aDataEnd, pCell, pCell+info.nLocal) ){
      testcase( pSrc!=pPage );
      *pRC = SQLITE_CORRUPT_BKPT;
      return;
    }
    ovfl = get4byte(&pCell[info.nSize-4]);
    ptrmapPut(pPage->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, pRC);
  }
}